

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O0

bool __thiscall QScrollArea::event(QScrollArea *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QEvent *in_RSI;
  QScrollAreaPrivate *d;
  QScrollAreaPrivate *in_stack_00000070;
  QEvent *in_stack_000000c0;
  QAbstractScrollArea *in_stack_000000c8;
  
  d_func((QScrollArea *)0x679701);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 != StyleChange) {
    TVar2 = QEvent::type(in_RSI);
    if (TVar2 != LayoutRequest) goto LAB_0067972e;
  }
  QScrollAreaPrivate::updateScrollBars(in_stack_00000070);
LAB_0067972e:
  bVar1 = QAbstractScrollArea::event(in_stack_000000c8,in_stack_000000c0);
  return bVar1;
}

Assistant:

bool QScrollArea::event(QEvent *e)
{
    Q_D(QScrollArea);
    if (e->type() == QEvent::StyleChange || e->type() == QEvent::LayoutRequest) {
        d->updateScrollBars();
    }
#ifdef QT_KEYPAD_NAVIGATION
    else if (QApplicationPrivate::keypadNavigationEnabled()) {
        if (e->type() == QEvent::Show)
            QApplication::instance()->installEventFilter(this);
        else if (e->type() == QEvent::Hide)
            QApplication::instance()->removeEventFilter(this);
    }
#endif
    return QAbstractScrollArea::event(e);
}